

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

void __thiscall
CMU462::Timeline::drawCircle(Timeline *this,double cx,double cy,double r,int num_segments)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  
  glBegin(2);
  iVar2 = 0;
  iVar1 = num_segments;
  if (num_segments < 1) {
    iVar1 = iVar2;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    fVar4 = ((float)iVar2 * 6.283185) / (float)num_segments;
    fVar3 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    dVar5 = (double)fVar3 * r + cx;
    dVar6 = (double)fVar4 * r + cy;
    glVertex2f(CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5),
               CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6));
  }
  glEnd();
  return;
}

Assistant:

void Timeline::drawCircle(double cx, double cy, double r, int num_segments)
  {
    glBegin(GL_LINE_LOOP);
    for (int i = 0; i < num_segments; i++)
	{
	  // Current Angle.
	  double theta = 2.0 * 3.1415926 * float(i) / float(num_segments);
	  double dx = r * cosf(theta);
	  double dy = r * sinf(theta);
	  glVertex2f(cx + dx, cy + dy);
    }
    glEnd();
  }